

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall GLDrawList::SortSpriteIntoPlane(GLDrawList *this,SortNode *head,SortNode *sort)

{
  float fVar1;
  int iVar2;
  int iVar3;
  GLDrawItem *pGVar4;
  GLFlat *pGVar5;
  GLSprite *pGVar6;
  SortNode *pSVar7;
  SortNode *pSVar8;
  double dVar9;
  GLSprite *pGVar10;
  SortNode *pSVar11;
  GLSprite *pGVar12;
  float fVar13;
  double dVar14;
  GLSprite s;
  GLSprite local_d0;
  
  dVar9 = ViewPos.Z;
  pGVar4 = (this->drawitems).Array;
  iVar2 = pGVar4[head->itemindex].index;
  iVar3 = pGVar4[sort->itemindex].index;
  pGVar5 = (this->flats).Array;
  pGVar6 = (this->sprites).Array;
  fVar1 = pGVar5[iVar2].z;
  dVar14 = (double)fVar1;
  if ((pGVar6[iVar3].z2 < fVar1 && fVar1 < pGVar6[iVar3].z1) ||
     (pGVar6[iVar3].modelframe != (FSpriteModelFrame *)0x0)) {
    memcpy(&local_d0,pGVar6 + iVar3,0xa0);
    AddSprite(this,&local_d0);
    if (((byte)gl.flags & 0x20) != 0) {
      pGVar6 = (this->sprites).Array;
      pGVar10 = pGVar6 + ((this->sprites).Count - 1);
      iVar3 = (this->drawitems).Array[sort->itemindex].index;
      fVar1 = pGVar5[iVar2].z;
      fVar13 = ((fVar1 - pGVar6[iVar3].z1) * (pGVar6[iVar3].vb - pGVar6[iVar3].vt)) /
               (pGVar6[iVar3].z2 - pGVar6[iVar3].z1) + pGVar6[iVar3].vt;
      if (dVar14 <= dVar9) {
        pGVar12 = pGVar6 + iVar3;
        pGVar10->z2 = fVar1;
        pGVar6[iVar3].z1 = fVar1;
        pGVar10->vb = fVar13;
      }
      else {
        pGVar6[iVar3].z2 = fVar1;
        pGVar10->z1 = fVar1;
        pGVar6[iVar3].vb = fVar13;
        pGVar12 = pGVar10;
      }
      pGVar12->vt = fVar13;
    }
    pSVar11 = StaticSortNodeArray::GetNew(&SortNodes);
    *(undefined8 *)pSVar11 = 0;
    pSVar11->parent = (SortNode *)0x0;
    pSVar11->next = (SortNode *)0x0;
    pSVar11->left = (SortNode *)0x0;
    pSVar11->equal = (SortNode *)0x0;
    pSVar11->right = (SortNode *)0x0;
    pSVar11->itemindex = (this->drawitems).Count - 1;
    pSVar7 = sort->parent;
    pSVar8 = sort->next;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar7->next = pSVar8;
    }
    if (pSVar8 != (SortNode *)0x0) {
      pSVar8->parent = pSVar7;
    }
    sort->parent = (SortNode *)0x0;
    sort->next = (SortNode *)0x0;
    pSVar7 = head->left;
    if (pSVar7 != (SortNode *)0x0) {
      sort->parent = pSVar7->parent;
      pSVar7->parent = sort;
      sort->next = pSVar7;
      if (sort->parent != (SortNode *)0x0) {
        sort->parent->next = sort;
      }
    }
    head->left = sort;
    pSVar7 = pSVar11->parent;
    pSVar8 = pSVar11->next;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar7->next = pSVar8;
    }
    if (pSVar8 != (SortNode *)0x0) {
      pSVar8->parent = pSVar7;
    }
    pSVar11->parent = (SortNode *)0x0;
    pSVar11->next = (SortNode *)0x0;
    pSVar7 = head->right;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar11->parent = pSVar7->parent;
      pSVar7->parent = pSVar11;
      pSVar11->next = pSVar7;
      if (pSVar11->parent != (SortNode *)0x0) {
        pSVar11->parent->next = pSVar11;
      }
    }
    head->right = pSVar11;
  }
  else {
    pSVar7 = sort->parent;
    pSVar8 = sort->next;
    if ((pGVar6[iVar3].z2 < fVar1 && ViewPos.Z >= dVar14) ||
       (fVar1 < pGVar6[iVar3].z1 && ViewPos.Z < dVar14)) {
      if (pSVar7 != (SortNode *)0x0) {
        pSVar7->next = pSVar8;
      }
      if (pSVar8 != (SortNode *)0x0) {
        pSVar8->parent = pSVar7;
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      pSVar7 = head->left;
      if (pSVar7 != (SortNode *)0x0) {
        sort->parent = pSVar7->parent;
        pSVar7->parent = sort;
        sort->next = pSVar7;
        if (sort->parent != (SortNode *)0x0) {
          sort->parent->next = sort;
        }
      }
      head->left = sort;
    }
    else {
      if (pSVar7 != (SortNode *)0x0) {
        pSVar7->next = pSVar8;
      }
      if (pSVar8 != (SortNode *)0x0) {
        pSVar8->parent = pSVar7;
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      pSVar7 = head->right;
      if (pSVar7 != (SortNode *)0x0) {
        sort->parent = pSVar7->parent;
        pSVar7->parent = sort;
        sort->next = pSVar7;
        if (sort->parent != (SortNode *)0x0) {
          sort->parent->next = sort;
        }
      }
      head->right = sort;
    }
  }
  return;
}

Assistant:

void GLDrawList::SortSpriteIntoPlane(SortNode * head,SortNode * sort)
{
	GLFlat * fh=&flats[drawitems[head->itemindex].index];
	GLSprite * ss=&sprites[drawitems[sort->itemindex].index];

	bool ceiling = fh->z > ViewPos.Z;

	if ((ss->z1>fh->z && ss->z2<fh->z) || ss->modelframe)
	{
		// We have to split this sprite
		GLSprite s=*ss;
		AddSprite(&s);	// add a copy to avoid reallocation issues.
	
		// Splitting is done in the shader with clip planes, if available
		if (gl.flags & RFL_NO_CLIP_PLANES)
		{
			GLSprite * ss1;
			ss1=&sprites[sprites.Size()-1];
			ss=&sprites[drawitems[sort->itemindex].index];	// may have been reallocated!
			float newtexv=ss->vt + ((ss->vb-ss->vt)/(ss->z2-ss->z1))*(fh->z-ss->z1);

			if (!ceiling)
			{
				ss->z1=ss1->z2=fh->z;
				ss->vt=ss1->vb=newtexv;
			}
			else
			{
				ss1->z1=ss->z2=fh->z;
				ss1->vt=ss->vb=newtexv;
			}
		}

		SortNode * sort2=SortNodes.GetNew();
		memset(sort2,0,sizeof(SortNode));
		sort2->itemindex=drawitems.Size()-1;

		head->AddToLeft(sort);
		head->AddToRight(sort2);
	}
	else if ((ss->z2<fh->z && !ceiling) || (ss->z1>fh->z && ceiling))	// completely on the left side
	{
		head->AddToLeft(sort);
	}
	else
	{
		head->AddToRight(sort);
	}

}